

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

ON_String __thiscall ON_String::Mid(ON_String *this,int i,int count)

{
  int iVar1;
  int in_ECX;
  undefined4 in_register_00000034;
  ON_String *this_00;
  int local_20;
  int count_local;
  int i_local;
  ON_String *this_local;
  ON_String *s;
  
  this_00 = (ON_String *)CONCAT44(in_register_00000034,i);
  ON_String(this);
  if (((-1 < count) && (iVar1 = Length(this_00), count < iVar1)) && (0 < in_ECX)) {
    iVar1 = Length(this_00);
    local_20 = in_ECX;
    if (iVar1 - count < in_ECX) {
      local_20 = Length(this_00);
      local_20 = local_20 - count;
    }
    CopyToArray(this,local_20,this_00->m_s + count);
  }
  return (ON_String)(char *)this;
}

Assistant:

ON_String ON_String::Mid(int i, int count) const
{
  ON_String(s);
  if ( i >= 0 && i < Length() && count > 0 ) {
    if ( count > Length() - i )
      count = Length() - i;
    s.CopyToArray( count, &m_s[i] );
  }
  return s;
}